

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_autoindex_module.c
# Opt level: O1

char * ngx_http_autoindex_merge_loc_conf(ngx_conf_t *cf,void *parent,void *child)

{
  long lVar1;
  
  if (*child == -1) {
    lVar1 = 0;
    if (*parent != -1) {
      lVar1 = *parent;
    }
    *(long *)child = lVar1;
  }
  if (*(long *)((long)child + 8) == -1) {
    lVar1 = 0;
    if (*(long *)((long)parent + 8) != -1) {
      lVar1 = *(long *)((long)parent + 8);
    }
    *(long *)((long)child + 8) = lVar1;
  }
  if (*(long *)((long)child + 0x10) == -1) {
    lVar1 = 0;
    if (*(long *)((long)parent + 0x10) != -1) {
      lVar1 = *(long *)((long)parent + 0x10);
    }
    *(long *)((long)child + 0x10) = lVar1;
  }
  if (*(long *)((long)child + 0x18) == -1) {
    lVar1 = 1;
    if (*(long *)((long)parent + 0x18) != -1) {
      lVar1 = *(long *)((long)parent + 0x18);
    }
    *(long *)((long)child + 0x18) = lVar1;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_autoindex_merge_loc_conf(ngx_conf_t *cf, void *parent, void *child)
{
    ngx_http_autoindex_loc_conf_t *prev = parent;
    ngx_http_autoindex_loc_conf_t *conf = child;

    ngx_conf_merge_value(conf->enable, prev->enable, 0);
    ngx_conf_merge_uint_value(conf->format, prev->format,
                              NGX_HTTP_AUTOINDEX_HTML);
    ngx_conf_merge_value(conf->localtime, prev->localtime, 0);
    ngx_conf_merge_value(conf->exact_size, prev->exact_size, 1);

    return NGX_CONF_OK;
}